

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_metric.c
# Opt level: O0

REF_STATUS
ref_metric_limit_aspect_ratio_field(REF_DBL *metric,REF_GRID ref_grid,REF_DBL *aspect_ratio_field)

{
  double dVar1;
  uint uVar2;
  double local_130;
  double local_128;
  double local_120;
  double local_118;
  double local_108;
  double local_100;
  double local_f8;
  double local_f0;
  double local_e8;
  double local_e0;
  double local_d0;
  double local_c8;
  REF_STATUS ref_private_macro_code_rss_5;
  REF_STATUS ref_private_macro_code_rss_4;
  REF_STATUS ref_private_macro_code_rss_3;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_DBL aspect_ratio;
  REF_INT node;
  REF_DBL limit_eig;
  REF_DBL max_eig;
  REF_DBL diag_system [12];
  REF_DBL *aspect_ratio_field_local;
  REF_GRID ref_grid_local;
  REF_DBL *metric_local;
  
  diag_system[0xb] = (REF_DBL)aspect_ratio_field;
  if (ref_grid->twod == 0) {
    for (aspect_ratio._4_4_ = 0; aspect_ratio._4_4_ < ref_grid->node->max;
        aspect_ratio._4_4_ = aspect_ratio._4_4_ + 1) {
      if (((-1 < aspect_ratio._4_4_) && (aspect_ratio._4_4_ < ref_grid->node->max)) &&
         (-1 < ref_grid->node->global[aspect_ratio._4_4_])) {
        dVar1 = *(double *)((long)diag_system[0xb] + (long)aspect_ratio._4_4_ * 8);
        uVar2 = ref_matrix_diag_m(metric + aspect_ratio._4_4_ * 6,&max_eig);
        if (uVar2 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",
                 0x825,"ref_metric_limit_aspect_ratio_field",(ulong)uVar2,"eigen decomp");
          return uVar2;
        }
        if (diag_system[0] <= max_eig) {
          local_f8 = max_eig;
        }
        else {
          local_f8 = diag_system[0];
        }
        if (diag_system[1] <= local_f8) {
          local_100 = local_f8;
        }
        else {
          local_100 = diag_system[1];
        }
        if (dVar1 * dVar1 * 1e+20 <= 0.0) {
          local_108 = -(dVar1 * dVar1 * 1e+20);
        }
        else {
          local_108 = dVar1 * dVar1 * 1e+20;
        }
        if (local_100 <= 0.0) {
          local_118 = -local_100;
        }
        else {
          local_118 = local_100;
        }
        if (local_118 < local_108) {
          local_130 = local_100 / (dVar1 * dVar1);
          local_120 = local_130;
          if (local_130 < max_eig) {
            local_120 = max_eig;
          }
          max_eig = local_120;
          local_128 = local_130;
          if (local_130 < diag_system[0]) {
            local_128 = diag_system[0];
          }
          diag_system[0] = local_128;
          if (local_130 < diag_system[1]) {
            local_130 = diag_system[1];
          }
          diag_system[1] = local_130;
          uVar2 = ref_matrix_form_m(&max_eig,metric + aspect_ratio._4_4_ * 6);
          if (uVar2 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                   ,0x831,"ref_metric_limit_aspect_ratio_field",(ulong)uVar2,"reform m");
            return uVar2;
          }
        }
      }
    }
  }
  else {
    for (aspect_ratio._4_4_ = 0; aspect_ratio._4_4_ < ref_grid->node->max;
        aspect_ratio._4_4_ = aspect_ratio._4_4_ + 1) {
      if (((-1 < aspect_ratio._4_4_) && (aspect_ratio._4_4_ < ref_grid->node->max)) &&
         (-1 < ref_grid->node->global[aspect_ratio._4_4_])) {
        dVar1 = *(double *)((long)diag_system[0xb] + (long)aspect_ratio._4_4_ * 8);
        uVar2 = ref_matrix_diag_m(metric + aspect_ratio._4_4_ * 6,&max_eig);
        if (uVar2 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",
                 0x813,"ref_metric_limit_aspect_ratio_field",(ulong)uVar2,"eigen decomp");
          return uVar2;
        }
        uVar2 = ref_matrix_descending_eig_twod(&max_eig);
        if (uVar2 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",
                 0x814,"ref_metric_limit_aspect_ratio_field",(ulong)uVar2,"2D eig sort");
          return uVar2;
        }
        if (diag_system[0] <= max_eig) {
          local_c8 = max_eig;
        }
        else {
          local_c8 = diag_system[0];
        }
        if (dVar1 * dVar1 * 1e+20 <= 0.0) {
          local_d0 = -(dVar1 * dVar1 * 1e+20);
        }
        else {
          local_d0 = dVar1 * dVar1 * 1e+20;
        }
        if (local_c8 <= 0.0) {
          local_e0 = -local_c8;
        }
        else {
          local_e0 = local_c8;
        }
        if (local_e0 < local_d0) {
          local_f0 = local_c8 / (dVar1 * dVar1);
          local_e8 = local_f0;
          if (local_f0 < max_eig) {
            local_e8 = max_eig;
          }
          max_eig = local_e8;
          if (local_f0 < diag_system[0]) {
            local_f0 = diag_system[0];
          }
          diag_system[0] = local_f0;
          uVar2 = ref_matrix_form_m(&max_eig,metric + aspect_ratio._4_4_ * 6);
          if (uVar2 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                   ,0x81d,"ref_metric_limit_aspect_ratio_field",(ulong)uVar2,"reform m");
            return uVar2;
          }
          uVar2 = ref_matrix_twod_m(metric + aspect_ratio._4_4_ * 6);
          if (uVar2 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                   ,0x81f,"ref_metric_limit_aspect_ratio_field",(ulong)uVar2,
                   "enforce 2D m for roundoff");
            return uVar2;
          }
        }
      }
    }
  }
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_metric_limit_aspect_ratio_field(
    REF_DBL *metric, REF_GRID ref_grid, REF_DBL *aspect_ratio_field) {
  REF_DBL diag_system[12];
  REF_DBL max_eig, limit_eig;
  REF_INT node;
  REF_DBL aspect_ratio;
  if (ref_grid_twod(ref_grid)) {
    each_ref_node_valid_node(ref_grid_node(ref_grid), node) {
      aspect_ratio = aspect_ratio_field[node];
      RSS(ref_matrix_diag_m(&(metric[6 * node]), diag_system), "eigen decomp");
      RSS(ref_matrix_descending_eig_twod(diag_system), "2D eig sort");
      max_eig = ref_matrix_eig(diag_system, 0);
      max_eig = MAX(ref_matrix_eig(diag_system, 1), max_eig);
      if (ref_math_divisible(max_eig, (aspect_ratio * aspect_ratio))) {
        limit_eig = max_eig / (aspect_ratio * aspect_ratio);
        ref_matrix_eig(diag_system, 0) =
            MAX(ref_matrix_eig(diag_system, 0), limit_eig);
        ref_matrix_eig(diag_system, 1) =
            MAX(ref_matrix_eig(diag_system, 1), limit_eig);
        RSS(ref_matrix_form_m(diag_system, &(metric[6 * node])), "reform m");
        RSS(ref_matrix_twod_m(&(metric[6 * node])),
            "enforce 2D m for roundoff");
      }
    }
  } else {
    each_ref_node_valid_node(ref_grid_node(ref_grid), node) {
      aspect_ratio = aspect_ratio_field[node];
      RSS(ref_matrix_diag_m(&(metric[6 * node]), diag_system), "eigen decomp");
      max_eig = ref_matrix_eig(diag_system, 0);
      max_eig = MAX(ref_matrix_eig(diag_system, 1), max_eig);
      max_eig = MAX(ref_matrix_eig(diag_system, 2), max_eig);
      if (ref_math_divisible(max_eig, (aspect_ratio * aspect_ratio))) {
        limit_eig = max_eig / (aspect_ratio * aspect_ratio);
        ref_matrix_eig(diag_system, 0) =
            MAX(ref_matrix_eig(diag_system, 0), limit_eig);
        ref_matrix_eig(diag_system, 1) =
            MAX(ref_matrix_eig(diag_system, 1), limit_eig);
        ref_matrix_eig(diag_system, 2) =
            MAX(ref_matrix_eig(diag_system, 2), limit_eig);
        RSS(ref_matrix_form_m(diag_system, &(metric[6 * node])), "reform m");
      }
    }
  }
  return REF_SUCCESS;
}